

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_17::NameGenerator::VisitFunc(NameGenerator *this,Index func_index,Func *func)

{
  bool bVar1;
  Result result;
  Func *func_local;
  Index func_index_local;
  NameGenerator *this_local;
  
  MaybeGenerateAndBindName(&this->module_->func_bindings,"$f",func_index,&func->name);
  GenerateAndBindLocalNames(this,func);
  this->label_count_ = 0;
  result = ExprVisitor::VisitFunc(&this->visitor_,func);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::VisitFunc(Index func_index, Func* func) {
  MaybeGenerateAndBindName(&module_->func_bindings, "$f", func_index,
                           &func->name);
  GenerateAndBindLocalNames(func);

  label_count_ = 0;
  CHECK_RESULT(visitor_.VisitFunc(func));
  return Result::Ok;
}